

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O0

function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *
chaiscript::dispatch::functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>
          (Const_Proxy_Function *func,Type_Conversions_State *t_conversions)

{
  initializer_list<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> __l;
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *in_RDI;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *in_stack_ffffffffffffff48;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *in_stack_ffffffffffffff50;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *in_stack_ffffffffffffff60;
  undefined1 *local_90;
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *this;
  Type_Conversions_State *pTVar1;
  undefined1 *puVar2;
  undefined1 local_51;
  Type_Conversions_State local_50;
  Type_Conversions_State *t_conversions_00;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *funcs;
  
  pTVar1 = &local_50;
  this = in_RDI;
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  funcs = (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           *)0x1;
  puVar2 = &local_51;
  t_conversions_00 = pTVar1;
  std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::allocator
            ((allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> *)
             0x33e280);
  __l._M_len = (size_type)puVar2;
  __l._M_array = (iterator)pTVar1;
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
            *)this,__l,(allocator_type *)in_RDI);
  functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>(funcs,t_conversions_00);
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(in_stack_ffffffffffffff60);
  std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::~allocator
            ((allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> *)
             0x33e2d4);
  local_90 = &stack0xffffffffffffffc0;
  do {
    local_90 = local_90 + 0xfffffffffffffff0;
    std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)0x33e2fa);
  } while ((Type_Conversions_State *)local_90 != &local_50);
  return this;
}

Assistant:

std::function<FunctionType>
      functor(Const_Proxy_Function func, const Type_Conversions_State *t_conversions)
      {
        return functor<FunctionType>(std::vector<Const_Proxy_Function>({std::move(func)}), t_conversions);
      }